

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void sh4asm_parser_input_token(sh4asm_tok *tk)

{
  tok_tp tVar1;
  pattern *ppVar2;
  char *pcVar3;
  ulong uVar4;
  sh4asm_tok *psVar5;
  ulong uVar6;
  
  uVar6 = (ulong)n_tokens;
  if (tk->tp == SH4ASM_TOK_NEWLINE) {
    for (ppVar2 = tok_ptrns; ppVar2->emit != (parser_emit_func)0x0; ppVar2 = ppVar2 + 1) {
      psVar5 = tokens;
      for (uVar4 = 0; (tVar1 = ppVar2->toks[uVar4], tVar1 != SH4ASM_TOK_NEWLINE && (uVar4 < uVar6));
          uVar4 = uVar4 + 1) {
        if (tVar1 != psVar5->tp) goto LAB_0010b6b3;
        psVar5 = psVar5 + 1;
      }
      if ((uint)uVar4 == n_tokens && tVar1 == SH4ASM_TOK_NEWLINE) {
        (*ppVar2->emit)();
        n_tokens = 0;
        return;
      }
LAB_0010b6b3:
    }
    printf("%u tokens\n\t");
    psVar5 = tokens;
    for (uVar6 = 0; uVar6 < n_tokens; uVar6 = uVar6 + 1) {
      pcVar3 = sh4asm_tok_as_str(psVar5);
      printf("%s ",pcVar3);
      psVar5 = psVar5 + 1;
    }
    puts("\n");
    pcVar3 = "unrecognized pattern";
  }
  else {
    if (n_tokens < 0x20) {
      n_tokens = n_tokens + 1;
      tokens[uVar6] = *tk;
      return;
    }
    pcVar3 = "too many tokens";
  }
  sh4asm_error(pcVar3);
}

Assistant:

void sh4asm_parser_input_token(struct sh4asm_tok const *tk) {
    if (tk->tp == SH4ASM_TOK_NEWLINE) {
        process_line();
        n_tokens = 0;
    } else {
        push_token(tk);
    }
}